

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocale.h
# Opt level: O2

void __thiscall cmLocaleRAII::~cmLocaleRAII(cmLocaleRAII *this)

{
  setlocale(0,(this->OldLocale)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~cmLocaleRAII() { setlocale(LC_CTYPE, this->OldLocale.c_str()); }